

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O2

void __thiscall ON_ClippingRegionPoints::Destroy(ON_ClippingRegionPoints *this)

{
  if ((this->m_buffer_point_capacity != 0) && (this->m_buffer != (void *)0x0)) {
    operator_delete(this->m_buffer,8);
  }
  this->m_buffer_point_capacity = 0;
  this->m_buffer = (void *)0x0;
  this->m_clip_flags = (uint *)0x0;
  this->m_and_clip_flags = 0;
  this->m_or_clip_flags = 0;
  this->m_point_count = 0;
  this->m_point_capacity = 0;
  this->m_clip_points = (ON_3dPoint *)0x0;
  return;
}

Assistant:

void ON_ClippingRegionPoints::Destroy()
{
  if (m_buffer_point_capacity > 0 && nullptr != m_buffer)
  {
    double* p = (double*)m_buffer;
    delete p;
  }
  memset(this, 0, sizeof(*this));
}